

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

void * dja::mat4::memcpy(void *__dest,void *__src,size_t __n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  mat4 local_48;
  
  local_48.m[0]._0_8_ = *__src;
  local_48.m[0]._8_8_ = *(undefined8 *)((long)__src + 8);
  local_48.m[1]._0_8_ = *(undefined8 *)((long)__src + 0x10);
  local_48.m[1]._8_8_ = *(undefined8 *)((long)__src + 0x18);
  local_48.m[2]._0_8_ = *(undefined8 *)((long)__src + 0x20);
  local_48.m[2]._8_8_ = *(undefined8 *)((long)__src + 0x28);
  local_48.m[3]._0_8_ = *(undefined8 *)((long)__src + 0x30);
  local_48.m[3]._8_8_ = *(undefined8 *)((long)__src + 0x38);
  if ((int)__n == 0) {
    transpose(&local_48);
  }
  else {
    uVar1 = *__src;
    uVar2 = *(undefined8 *)((long)__src + 8);
    uVar3 = *(undefined8 *)((long)__src + 0x10);
    uVar4 = *(undefined8 *)((long)__src + 0x18);
    uVar5 = *(undefined8 *)((long)__src + 0x20);
    uVar6 = *(undefined8 *)((long)__src + 0x28);
    uVar7 = *(undefined8 *)((long)__src + 0x38);
    *(undefined8 *)((long)__dest + 0x30) = *(undefined8 *)((long)__src + 0x30);
    *(undefined8 *)((long)__dest + 0x38) = uVar7;
    *(undefined8 *)((long)__dest + 0x20) = uVar5;
    *(undefined8 *)((long)__dest + 0x28) = uVar6;
    *(undefined8 *)((long)__dest + 0x10) = uVar3;
    *(undefined8 *)((long)__dest + 0x18) = uVar4;
    *(undefined8 *)__dest = uVar1;
    *(undefined8 *)((long)__dest + 8) = uVar2;
  }
  return __dest;
}

Assistant:

mat4 mat4::memcpy(const float_t *v, bool rowmajor)
{
    mat4 m;
    std::memcpy(&m[0][0], v, sizeof(mat4));
    return rowmajor ? m : transpose(m);
}